

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMInteractionType.hpp
# Opt level: O0

void __thiscall OpenMD::EAMInteractionType::~EAMInteractionType(EAMInteractionType *this)

{
  undefined8 *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  *in_RDI = &PTR__EAMInteractionType_004ff378;
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  NonBondedInteractionType::~NonBondedInteractionType((NonBondedInteractionType *)0x2994b4);
  return;
}

Assistant:

EAMInteractionType(RealType re, RealType alpha, RealType beta, RealType A,
                       RealType B, RealType kappa, RealType lambda) {
      interactionType_ = eamitZhou;
      setEAMZhou();
      re_     = re;
      alpha_  = alpha;
      beta_   = beta;
      A_      = A;
      B_      = B;
      kappa_  = kappa;
      lambda_ = lambda;
    }